

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O0

void test_init_start_stop_destroy_multiple_streams(int early,int delay_ms)

{
  bool bVar1;
  cubeb_stream_params *pcVar2;
  AssertHelper *pAVar3;
  size_t sVar4;
  int in_ESI;
  int in_EDI;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  cubeb_stream_params params;
  cubeb_stream *stream [8];
  cubeb *ctx;
  int r;
  size_t i;
  cubeb_stream *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  code *in_stack_fffffffffffffdf8;
  code *in_stack_fffffffffffffe00;
  int *in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  cubeb_stream_params *pcVar5;
  Type type;
  cubeb_stream_params *in_stack_fffffffffffffe20;
  cubeb_devid in_stack_fffffffffffffe28;
  cubeb_devid in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  cubeb *in_stack_fffffffffffffe50;
  Message *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe80;
  uint in_stack_fffffffffffffe88;
  cubeb_data_callback in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  void *in_stack_fffffffffffffea0;
  AssertionResult local_138 [2];
  undefined8 local_118;
  AssertionResult local_110 [2];
  undefined4 local_ec;
  AssertionResult local_e8 [2];
  undefined8 local_c8;
  AssertionResult local_c0;
  uint local_ac;
  undefined4 local_94;
  AssertionResult local_90;
  cubeb_stream local_7c;
  undefined4 local_6c;
  cubeb_stream *local_68 [9];
  int local_1c;
  cubeb_stream_params *local_18;
  int local_10;
  int local_c;
  
  local_10 = in_ESI;
  local_c = in_EDI;
  local_1c = common_init((cubeb **)in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
  local_94 = 0;
  testing::internal::EqHelper::
  Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_mozilla[P]cubeb_include_cubeb_cubeb_h:300:1),_nullptr>
            ((char *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
             (int *)in_stack_fffffffffffffdf8,
             (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_90);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe20);
    testing::AssertionResult::failure_message((AssertionResult *)0x10ffb6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe20,
               (Type)((ulong)in_stack_fffffffffffffe18 >> 0x20),in_stack_fffffffffffffe10,
               (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),(char *)in_stack_fffffffffffffe00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    testing::Message::~Message((Message *)0x110006);
  }
  local_ac = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11002b);
  if (local_ac == 0) {
    local_c8 = 0;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              ((char *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
               (cubeb **)in_stack_fffffffffffffdf8,
               (void **)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe20);
      testing::AssertionResult::failure_message((AssertionResult *)0x1100a3);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffe20,
                 (Type)((ulong)in_stack_fffffffffffffe18 >> 0x20),in_stack_fffffffffffffe10,
                 (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),(char *)in_stack_fffffffffffffe00);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe68);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      testing::Message::~Message((Message *)0x1100f3);
    }
    local_ac = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x110118);
    if (local_ac == 0) {
      local_7c.context._0_4_ = 0;
      local_7c.context._4_4_ = 0xac44;
      local_7c.user_ptr._0_4_ = 1;
      local_7c.user_ptr._4_4_ = 4;
      local_6c = 0;
      local_18 = (cubeb_stream_params *)0x0;
      while (pcVar5 = local_18,
            pcVar2 = (cubeb_stream_params *)
                     ARRAY_LENGTH<cubeb_stream*,8ul>((cubeb_stream *(*) [8])local_68),
            pcVar5 < pcVar2) {
        in_stack_fffffffffffffde8 = &local_7c;
        in_stack_fffffffffffffdf0 = 0x113a;
        in_stack_fffffffffffffdf8 = test_data_callback;
        in_stack_fffffffffffffe00 = test_state_callback;
        in_stack_fffffffffffffe08 = &dummy;
        local_1c = cubeb_stream_init(in_stack_fffffffffffffe50,
                                     (cubeb_stream **)
                                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                                     in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,pcVar5,
                                     in_stack_fffffffffffffe28,
                                     (cubeb_stream_params *)in_stack_fffffffffffffe80._M_head_impl,
                                     in_stack_fffffffffffffe88,in_stack_fffffffffffffe90,
                                     (cubeb_state_callback)
                                     CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                     in_stack_fffffffffffffea0);
        local_ec = 0;
        testing::internal::EqHelper::
        Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_mozilla[P]cubeb_include_cubeb_cubeb_h:300:1),_nullptr>
                  ((char *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
                   (int *)in_stack_fffffffffffffdf8,
                   (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e8);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe20);
          testing::AssertionResult::failure_message((AssertionResult *)0x110272);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe20,
                     (Type)((ulong)in_stack_fffffffffffffe18 >> 0x20),in_stack_fffffffffffffe10,
                     (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                     (char *)in_stack_fffffffffffffe00);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe68);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          testing::Message::~Message((Message *)0x1102c2);
        }
        local_ac = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1102e7);
        if (local_ac != 0) {
          return;
        }
        local_118 = 0;
        testing::internal::CmpHelperNE<cubeb_stream*,decltype(nullptr)>
                  ((char *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
                   (cubeb_stream **)in_stack_fffffffffffffdf8,
                   (void **)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_110);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe20);
          testing::AssertionResult::failure_message((AssertionResult *)0x11036e);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe20,
                     (Type)((ulong)in_stack_fffffffffffffe18 >> 0x20),in_stack_fffffffffffffe10,
                     (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                     (char *)in_stack_fffffffffffffe00);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe68);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          testing::Message::~Message((Message *)0x1103be);
        }
        local_ac = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1103e3);
        if (local_ac != 0) {
          return;
        }
        if (local_c != 0) {
          local_1c = cubeb_stream_start(in_stack_fffffffffffffde8);
          testing::internal::EqHelper::
          Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_mozilla[P]cubeb_include_cubeb_cubeb_h:300:1),_nullptr>
                    ((char *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
                     (int *)in_stack_fffffffffffffdf8,
                     (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_138);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe20);
            testing::AssertionResult::failure_message((AssertionResult *)0x110484);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffe20,
                       (Type)((ulong)in_stack_fffffffffffffe18 >> 0x20),in_stack_fffffffffffffe10,
                       (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                       (char *)in_stack_fffffffffffffe00);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)
                       ,in_stack_fffffffffffffe68);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0)
                      );
            testing::Message::~Message((Message *)0x1104d4);
          }
          local_ac = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1104f9);
          if (local_ac != 0) {
            return;
          }
        }
        local_18 = (cubeb_stream_params *)((long)&local_18->format + 1);
      }
      if (local_c == 0) {
        local_18 = (cubeb_stream_params *)0x0;
        while (pcVar5 = local_18,
              pcVar2 = (cubeb_stream_params *)
                       ARRAY_LENGTH<cubeb_stream*,8ul>((cubeb_stream *(*) [8])local_68),
              pcVar5 < pcVar2) {
          local_1c = cubeb_stream_start(in_stack_fffffffffffffde8);
          testing::internal::EqHelper::
          Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_mozilla[P]cubeb_include_cubeb_cubeb_h:300:1),_nullptr>
                    ((char *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
                     (int *)in_stack_fffffffffffffdf8,
                     (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          bVar1 = testing::AssertionResult::operator_cast_to_bool
                            ((AssertionResult *)&stack0xfffffffffffffea0);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe20);
            testing::AssertionResult::failure_message((AssertionResult *)0x1105ee);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffe20,
                       (Type)((ulong)in_stack_fffffffffffffe18 >> 0x20),in_stack_fffffffffffffe10,
                       (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                       (char *)in_stack_fffffffffffffe00);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)
                       ,in_stack_fffffffffffffe68);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0)
                      );
            testing::Message::~Message((Message *)0x11063e);
          }
          local_ac = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x110663);
          if (local_ac != 0) {
            return;
          }
          local_18 = (cubeb_stream_params *)((long)&local_18->format + 1);
        }
      }
      if (local_10 != 0) {
        delay(0);
      }
      if (local_c == 0) {
        local_18 = (cubeb_stream_params *)0x0;
        while (in_stack_fffffffffffffe20 = local_18,
              pAVar3 = (AssertHelper *)
                       ARRAY_LENGTH<cubeb_stream*,8ul>((cubeb_stream *(*) [8])local_68),
              in_stack_fffffffffffffe20 < pAVar3) {
          local_1c = cubeb_stream_stop(in_stack_fffffffffffffde8);
          in_stack_fffffffffffffe74 = 0;
          testing::internal::EqHelper::
          Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_mozilla[P]cubeb_include_cubeb_cubeb_h:300:1),_nullptr>
                    ((char *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
                     (int *)in_stack_fffffffffffffdf8,
                     (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          bVar1 = testing::AssertionResult::operator_cast_to_bool
                            ((AssertionResult *)&stack0xfffffffffffffe78);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe20);
            testing::AssertionResult::failure_message((AssertionResult *)0x11076e);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffe20,
                       (Type)((ulong)in_stack_fffffffffffffe18 >> 0x20),in_stack_fffffffffffffe10,
                       (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                       (char *)in_stack_fffffffffffffe00);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)
                       ,in_stack_fffffffffffffe68);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0)
                      );
            testing::Message::~Message((Message *)0x1107b5);
          }
          local_ac = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1107da);
          if (local_ac != 0) {
            return;
          }
          local_18 = (cubeb_stream_params *)((long)&local_18->format + 1);
        }
      }
      local_18 = (cubeb_stream_params *)0x0;
      while (pcVar5 = local_18,
            sVar4 = ARRAY_LENGTH<cubeb_stream*,8ul>((cubeb_stream *(*) [8])local_68), pcVar5 < sVar4
            ) {
        if (local_c != 0) {
          local_1c = cubeb_stream_stop(in_stack_fffffffffffffde8);
          type = (Type)((ulong)pcVar5 >> 0x20);
          testing::internal::EqHelper::
          Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_mozilla[P]cubeb_include_cubeb_cubeb_h:300:1),_nullptr>
                    ((char *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
                     (int *)in_stack_fffffffffffffdf8,
                     (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          bVar1 = testing::AssertionResult::operator_cast_to_bool
                            ((AssertionResult *)&stack0xfffffffffffffe50);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe20);
            testing::AssertionResult::failure_message((AssertionResult *)0x1108bd);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffe20,type,in_stack_fffffffffffffe10,
                       (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                       (char *)in_stack_fffffffffffffe00);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)
                       ,in_stack_fffffffffffffe68);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0)
                      );
            testing::Message::~Message((Message *)0x1108fe);
          }
          local_ac = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x110920);
          if (local_ac != 0) {
            return;
          }
        }
        cubeb_stream_destroy((cubeb_stream *)0x110946);
        local_18 = (cubeb_stream_params *)((long)local_18 + 1);
      }
      cubeb_destroy((cubeb *)0x11096c);
    }
  }
  return;
}

Assistant:

static void
test_init_start_stop_destroy_multiple_streams(int early, int delay_ms)
{
  size_t i;
  int r;
  cubeb * ctx;
  cubeb_stream * stream[8];
  cubeb_stream_params params;

  r = common_init(&ctx, "test_sanity");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  params.format = STREAM_FORMAT;
  params.rate = STREAM_RATE;
  params.channels = STREAM_CHANNELS;
  params.layout = STREAM_LAYOUT;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  for (i = 0; i < ARRAY_LENGTH(stream); ++i) {
    r = cubeb_stream_init(ctx, &stream[i], "test", NULL, NULL, NULL, &params,
                          STREAM_LATENCY, test_data_callback,
                          test_state_callback, &dummy);
    ASSERT_EQ(r, CUBEB_OK);
    ASSERT_NE(stream[i], nullptr);
    if (early) {
      r = cubeb_stream_start(stream[i]);
      ASSERT_EQ(r, CUBEB_OK);
    }
  }

  if (!early) {
    for (i = 0; i < ARRAY_LENGTH(stream); ++i) {
      r = cubeb_stream_start(stream[i]);
      ASSERT_EQ(r, CUBEB_OK);
    }
  }

  if (delay_ms) {
    delay(delay_ms);
  }

  if (!early) {
    for (i = 0; i < ARRAY_LENGTH(stream); ++i) {
      r = cubeb_stream_stop(stream[i]);
      ASSERT_EQ(r, CUBEB_OK);
    }
  }

  for (i = 0; i < ARRAY_LENGTH(stream); ++i) {
    if (early) {
      r = cubeb_stream_stop(stream[i]);
      ASSERT_EQ(r, CUBEB_OK);
    }
    cubeb_stream_destroy(stream[i]);
  }

  cubeb_destroy(ctx);
}